

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O3

idx_t duckdb::WindowBoundariesState::FindPrevStart(ValidityMask *mask,idx_t l,idx_t r,idx_t *n)

{
  unsigned_long *puVar1;
  ulong uVar2;
  idx_t iVar3;
  ulong uVar4;
  bool bVar5;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    iVar3 = *n;
    if (iVar3 + l < r) {
      l = r - iVar3;
    }
    *n = (iVar3 - r) + l;
  }
  else if (l < r) {
    iVar3 = *n;
    do {
      uVar4 = (ulong)((uint)(r - 1) & 0x3f);
      uVar2 = puVar1[r - 1 >> 6];
      if (uVar4 == 0x3f && uVar2 == 0) {
        r = r - 0x40;
      }
      else {
        do {
          if (r <= l) break;
          if ((uVar2 >> (uVar4 & 0x3f) & 1) != 0) {
            iVar3 = iVar3 - 1;
            *n = iVar3;
            if (iVar3 == 0) {
              return r - 1;
            }
          }
          r = r - 1;
          bVar5 = uVar4 != 0;
          uVar4 = uVar4 - 1;
        } while (bVar5);
      }
    } while (l < r);
  }
  return l;
}

Assistant:

idx_t WindowBoundariesState::FindPrevStart(const ValidityMask &mask, const idx_t l, idx_t r, idx_t &n) {
	if (mask.AllValid()) {
		auto start = (r <= l + n) ? l : r - n;
		n -= r - start;
		return start;
	}

	while (l < r) {
		// If r is aligned with the start of a block, and the previous block is blank,
		// then skip backwards one block.
		idx_t entry_idx;
		idx_t shift;
		mask.GetEntryIndex(r - 1, entry_idx, shift);

		const auto block = mask.GetValidityEntry(entry_idx);
		if (mask.NoneValid(block) && (shift + 1 == ValidityMask::BITS_PER_VALUE)) {
			// r is nonzero (> l) and word aligned, so this will not underflow.
			r -= ValidityMask::BITS_PER_VALUE;
			continue;
		}

		// Loop backwards over the block
		// shift is probing r-1 >= l >= 0
		for (++shift; shift-- > 0 && l < r; --r) {
			// l < r ensures n == 1 if result is supposed to be NULL because of EXCLUDE
			if (mask.RowIsValid(block, shift) && --n == 0) {
				return MaxValue(l, r - 1);
			}
		}
	}

	//	Didn't find a start so return the start of the range
	return l;
}